

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

void __thiscall QTapGesture::QTapGesture(QTapGesture *this,QObject *parent)

{
  QTapGesturePrivate *this_00;
  
  this_00 = (QTapGesturePrivate *)operator_new(0xb8);
  QTapGesturePrivate::QTapGesturePrivate(this_00);
  QGesture::QGesture(&this->super_QGesture,(QGesturePrivate *)this_00,parent);
  *(undefined ***)&this->super_QGesture = &PTR_metaObject_007bffe0;
  *(undefined4 *)(*(long *)&(this->super_QGesture).field_0x8 + 0x78) = 1;
  return;
}

Assistant:

QTapGesture::QTapGesture(QObject *parent)
    : QGesture(*new QTapGesturePrivate, parent)
{
    d_func()->gestureType = Qt::TapGesture;
}